

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::ClientImpl::read_response_line(ClientImpl *this,Stream *strm,Request *req,Response *res)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  __ssize_t _Var5;
  size_t sVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *__n;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *__n_00;
  char **ppcVar10;
  cmatch m;
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  char *local_8c8;
  undefined8 local_8c0;
  char local_8b8;
  undefined7 uStack_8b7;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_8a8;
  char *local_880;
  string *local_878;
  undefined1 local_870 [64];
  char local_830 [2048];
  
  local_870._32_8_ = local_870 + 0x30;
  local_870._8_8_ = local_830;
  local_870._16_8_ = 0x800;
  local_870._24_8_ = 0;
  local_870._40_8_ = 0;
  local_870[0x30] = '\0';
  local_870._0_8_ = strm;
  _Var5 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_870,(char **)strm,(size_t *)req,
                     (FILE *)local_870._32_8_);
  if ((char)_Var5 == '\0') {
    bVar3 = false;
  }
  else {
    if (read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)::
        re_abi_cxx11_ == '\0') goto LAB_00111b09;
    while( true ) {
      local_8a8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_8a8._M_begin = (char *)0x0;
      local_8a8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_8a8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar8 = (undefined8 *)(local_870 + 0x20);
      if (local_870._40_8_ == 0) {
        puVar8 = (undefined8 *)(local_870 + 8);
      }
      pcVar2 = (char *)*puVar8;
      sVar6 = strlen(pcVar2);
      bVar3 = std::__detail::
              __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (pcVar2,pcVar2 + sVar6,&local_8a8,
                         &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                          ::re_abi_cxx11_,0);
      if (!bVar3) break;
      if (local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        bVar3 = ((long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U <
                0xfffffffffffffffe;
      }
      ppcVar10 = (char **)&((FILE *)((long)local_8a8.
                                           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + -0xd8))->
                           _offset;
      if (bVar3) {
        ppcVar10 = (char **)((long)local_8a8.
                                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x18);
      }
      local_8c8 = &local_8b8;
      if (*(char *)(ppcVar10 + 2) == '\x01') {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,*ppcVar10,ppcVar10[1]);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
      }
      std::__cxx11::string::operator=((string *)res,(string *)&local_8c8);
      if (local_8c8 != &local_8b8) {
        operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
      }
      if (local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        bVar3 = ((long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 6U <
                0xfffffffffffffffd;
      }
      ppcVar10 = (char **)&((FILE *)((long)local_8a8.
                                           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + -0xd8))->
                           _offset;
      if (bVar3) {
        ppcVar10 = (char **)((long)local_8a8.
                                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x30);
      }
      if (*(char *)(ppcVar10 + 2) == '\x01') {
        local_8c8 = &local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,*ppcVar10,ppcVar10[1]);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
        local_8c8 = &local_8b8;
      }
      pcVar2 = local_8c8;
      req = (Request *)__errno_location();
      iVar4 = *(int *)&(req->method)._M_dataplus._M_p;
      *(int *)&(req->method)._M_dataplus._M_p = 0;
      lVar7 = strtol(pcVar2,&local_880,10);
      if (local_880 == pcVar2) {
        std::__throw_invalid_argument("stoi");
LAB_00111b6c:
        uVar9 = std::__throw_out_of_range("stoi");
        __cxa_guard_abort(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                           ::re_abi_cxx11_);
        if ((FILE *)local_870._32_8_ != (FILE *)(local_870 + 0x30)) {
          operator_delete((void *)local_870._32_8_,CONCAT71(local_870._49_7_,local_870[0x30]) + 1);
        }
        _Unwind_Resume(uVar9);
      }
      if (((int)lVar7 != lVar7) || (iVar1 = *(int *)&(req->method)._M_dataplus._M_p, iVar1 == 0x22))
      goto LAB_00111b6c;
      if (iVar1 == 0) {
        *(int *)&(req->method)._M_dataplus._M_p = iVar4;
      }
      res->status = (int)lVar7;
      if (local_8c8 != &local_8b8) {
        operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
      }
      if (local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        bVar3 = ((long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 7U <
                0xfffffffffffffffc;
      }
      __stream = (FILE *)((long)local_8a8.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x48);
      ppcVar10 = (char **)&((FILE *)((long)local_8a8.
                                           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + -0xd8))->
                           _offset;
      if (bVar3) {
        ppcVar10 = (char **)__stream;
      }
      if (*(char *)(ppcVar10 + 2) == '\x01') {
        local_8c8 = &local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,*ppcVar10,ppcVar10[1]);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
        local_8c8 = &local_8b8;
      }
      local_878 = (string *)&res->reason;
      ppcVar10 = &local_8c8;
      std::__cxx11::string::operator=(local_878,(string *)&local_8c8);
      __n_00 = extraout_RDX;
      if (local_8c8 != &local_8b8) {
        ppcVar10 = (char **)(CONCAT71(uStack_8b7,local_8b8) + 1);
        operator_delete(local_8c8,(ulong)ppcVar10);
        __n_00 = extraout_RDX_00;
      }
      bVar3 = true;
      if (res->status != 100) goto LAB_00111aa4;
LAB_0011182a:
      _Var5 = detail::stream_line_reader::getline
                        ((stream_line_reader *)local_870,ppcVar10,__n_00,__stream);
      if (((char)_Var5 == '\0') ||
         (_Var5 = detail::stream_line_reader::getline
                            ((stream_line_reader *)local_870,ppcVar10,__n,__stream),
         (char)_Var5 == '\0')) {
LAB_00111aa2:
        bVar3 = false;
        goto LAB_00111aa4;
      }
      puVar8 = (undefined8 *)(local_870 + 0x20);
      if (local_870._40_8_ == 0) {
        puVar8 = (undefined8 *)(local_870 + 8);
      }
      pcVar2 = (char *)*puVar8;
      sVar6 = strlen(pcVar2);
      bVar3 = std::__detail::
              __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (pcVar2,pcVar2 + sVar6,&local_8a8,
                         &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                          ::re_abi_cxx11_,0);
      if (!bVar3) goto LAB_00111aa2;
      if (local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        bVar3 = ((long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U <
                0xfffffffffffffffe;
      }
      if (bVar3) {
        ppcVar10 = (char **)((long)local_8a8.
                                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x18);
      }
      else {
        ppcVar10 = (char **)&((FILE *)((long)local_8a8.
                                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish + -0xd8))->
                             _offset;
      }
      if (*(char *)(ppcVar10 + 2) == '\x01') {
        local_8c8 = &local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,*ppcVar10,ppcVar10[1]);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
        local_8c8 = &local_8b8;
      }
      std::__cxx11::string::operator=((string *)res,(string *)&local_8c8);
      if (local_8c8 != &local_8b8) {
        operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
      }
      if (local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        bVar3 = ((long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 6U <
                0xfffffffffffffffd;
      }
      if (bVar3) {
        ppcVar10 = (char **)((long)local_8a8.
                                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x30);
      }
      else {
        ppcVar10 = (char **)&((FILE *)((long)local_8a8.
                                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish + -0xd8))->
                             _offset;
      }
      if (*(char *)(ppcVar10 + 2) == '\x01') {
        local_8c8 = &local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,*ppcVar10,ppcVar10[1]);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
        local_8c8 = &local_8b8;
      }
      pcVar2 = local_8c8;
      iVar4 = *(int *)&(req->method)._M_dataplus._M_p;
      *(int *)&(req->method)._M_dataplus._M_p = 0;
      lVar7 = strtol(local_8c8,&local_880,10);
      if (local_880 != pcVar2) {
        if ((lVar7 - 0x80000000U < 0xffffffff00000000) ||
           (iVar1 = *(int *)&(req->method)._M_dataplus._M_p, iVar1 == 0x22)) goto LAB_00111afd;
        if (iVar1 == 0) {
          *(int *)&(req->method)._M_dataplus._M_p = iVar4;
        }
        res->status = (int)lVar7;
        if (local_8c8 != &local_8b8) {
          operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
        }
        if (local_8a8.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_8a8.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar3 = false;
        }
        else {
          bVar3 = ((long)local_8a8.
                         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_8a8.
                         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 7U
                  < 0xfffffffffffffffc;
        }
        if (bVar3) {
          ppcVar10 = (char **)((long)local_8a8.
                                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x48);
          __stream = (FILE *)local_8a8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ppcVar10 = (char **)&((FILE *)((long)local_8a8.
                                               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish + -0xd8))
                               ->_offset;
          __stream = (FILE *)ppcVar10;
        }
        if (*(char *)(ppcVar10 + 2) == '\x01') {
          local_8c8 = &local_8b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_8c8,*ppcVar10,ppcVar10[1]);
        }
        else {
          local_8c0 = 0;
          local_8b8 = '\0';
          local_8c8 = &local_8b8;
        }
        ppcVar10 = &local_8c8;
        std::__cxx11::string::operator=(local_878,(string *)&local_8c8);
        __n_00 = extraout_RDX_01;
        if (local_8c8 != &local_8b8) {
          ppcVar10 = (char **)(CONCAT71(uStack_8b7,local_8b8) + 1);
          operator_delete(local_8c8,(ulong)ppcVar10);
          __n_00 = extraout_RDX_02;
        }
        if (res->status != 100) {
          bVar3 = true;
          goto LAB_00111aa4;
        }
        goto LAB_0011182a;
      }
      std::__throw_invalid_argument("stoi");
LAB_00111afd:
      std::__throw_out_of_range("stoi");
LAB_00111b09:
      iVar4 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                                   ::re_abi_cxx11_);
      if (iVar4 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                    ::re_abi_cxx11_,"(HTTP/1\\.[01]) (\\d{3}) (.*?)\r\n",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                      ::re_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                             ::re_abi_cxx11_);
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)req);
    bVar3 = iVar4 == 0;
LAB_00111aa4:
    if ((FILE *)local_8a8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (FILE *)0x0) {
      operator_delete(local_8a8.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_8a8.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_8a8.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((FILE *)local_870._32_8_ != (FILE *)(local_870 + 0x30)) {
    operator_delete((void *)local_870._32_8_,CONCAT71(local_870._49_7_,local_870[0x30]) + 1);
  }
  return bVar3;
}

Assistant:

inline bool ClientImpl::read_response_line(Stream &strm, const Request &req,
											   Response &res) {
		std::array<char, 2048> buf;

		detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

		if (!line_reader.getline()) { return false; }

		const static std::regex re("(HTTP/1\\.[01]) (\\d{3}) (.*?)\r\n");

		std::cmatch m;
		if (!std::regex_match(line_reader.ptr(), m, re)) {
			return req.method == "CONNECT";
		}
		res.version = std::string(m[1]);
		res.status = std::stoi(std::string(m[2]));
		res.reason = std::string(m[3]);

		// Ignore '100 Continue'
		while (res.status == 100) {
			if (!line_reader.getline()) { return false; } // CRLF
			if (!line_reader.getline()) { return false; } // next response line

			if (!std::regex_match(line_reader.ptr(), m, re)) { return false; }
			res.version = std::string(m[1]);
			res.status = std::stoi(std::string(m[2]));
			res.reason = std::string(m[3]);
		}

		return true;
	}